

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O0

void __thiscall
SwitchIRBuilder::BuildEmptyCasesInstr(SwitchIRBuilder *this,CaseNode *caseNode,uint32 fallThrOffset)

{
  OpCode OVar1;
  SwitchAdapter *pSVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  uint32 uVar6;
  BranchInstr *pBVar7;
  Opnd *src1Opnd_00;
  Opnd *pOVar8;
  Opnd *pOVar9;
  undefined4 *puVar10;
  Opnd *src1Opnd;
  BranchInstr *branchInstr;
  uint32 fallThrOffset_local;
  CaseNode *caseNode_local;
  SwitchIRBuilder *this_local;
  
  pBVar7 = CaseNode::GetCaseInstr(caseNode);
  src1Opnd_00 = IR::Instr::GetSrc1(&pBVar7->super_Instr);
  pOVar8 = CaseNode::GetLowerBound(caseNode);
  pOVar9 = CaseNode::GetUpperBound(caseNode);
  if (pOVar8 == pOVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SwitchIRBuilder.cpp"
                       ,0x1b4,"(caseNode->GetLowerBound() != caseNode->GetUpperBound())",
                       "The upper bound and lower bound should not be the same");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  OVar1 = this->m_ltOp;
  pOVar8 = CaseNode::GetLowerBound(caseNode);
  pBVar7 = IR::BranchInstr::New(OVar1,(LabelInstr *)0x0,src1Opnd_00,pOVar8,this->m_func);
  pBVar7->field_0x58 = pBVar7->field_0x58 & 0xfd | 2;
  pSVar2 = this->m_adapter;
  uVar5 = CaseNode::GetOffset(caseNode);
  (**pSVar2->_vptr_SwitchAdapter)(pSVar2,pBVar7,(ulong)uVar5,(ulong)fallThrOffset,1);
  OVar1 = this->m_leOp;
  pOVar8 = CaseNode::GetUpperBound(caseNode);
  pBVar7 = IR::BranchInstr::New(OVar1,(LabelInstr *)0x0,src1Opnd_00,pOVar8,this->m_func);
  pBVar7->field_0x58 = pBVar7->field_0x58 & 0xfd | 2;
  pSVar2 = this->m_adapter;
  uVar5 = CaseNode::GetOffset(caseNode);
  uVar6 = CaseNode::GetTargetOffset(caseNode);
  (**pSVar2->_vptr_SwitchAdapter)(pSVar2,pBVar7,(ulong)uVar5,(ulong)uVar6,1);
  BuildBailOnNotInteger(this);
  return;
}

Assistant:

void
SwitchIRBuilder::BuildEmptyCasesInstr(CaseNode* caseNode, uint32 fallThrOffset)
{
    IR::BranchInstr* branchInstr;
    IR::Opnd* src1Opnd;

    src1Opnd = caseNode->GetCaseInstr()->GetSrc1();

    AssertMsg(caseNode->GetLowerBound() != caseNode->GetUpperBound(), "The upper bound and lower bound should not be the same");

    //Generate <lb instruction
    branchInstr = IR::BranchInstr::New(m_ltOp, nullptr, src1Opnd, caseNode->GetLowerBound(), m_func);
    branchInstr->m_isSwitchBr = true;
    m_adapter->AddBranchInstr(branchInstr, caseNode->GetOffset(), fallThrOffset, true);

    //Generate <=ub instruction
    branchInstr = IR::BranchInstr::New(m_leOp, nullptr, src1Opnd, caseNode->GetUpperBound(), m_func);
    branchInstr->m_isSwitchBr = true;
    m_adapter->AddBranchInstr(branchInstr, caseNode->GetOffset(), caseNode->GetTargetOffset(), true);

    BuildBailOnNotInteger();
}